

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O0

string * __thiscall
iutest::internal::FormatForComparisonFailureMessage<float,float>
          (string *__return_storage_ptr__,internal *this,float *value,float *param_2)

{
  float *param_1_local;
  float *value_local;
  
  PrintToString<float>(__return_storage_ptr__,(float *)this);
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string FormatForComparisonFailureMessage(const T1& value, const T2& /*other_operand*/)
{
    return PrintToString(value);
}